

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrShaderProgram.cpp
# Opt level: O1

ShaderProgramDeclaration * __thiscall
sglr::pdec::ShaderProgramDeclaration::operator<<
          (ShaderProgramDeclaration *this,VertexToFragmentVarying *v)

{
  pointer *ppVVar1;
  iterator __position;
  
  __position._M_current =
       (this->m_vertexToFragmentVaryings).
       super__Vector_base<sglr::pdec::VertexToFragmentVarying,_std::allocator<sglr::pdec::VertexToFragmentVarying>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_vertexToFragmentVaryings).
      super__Vector_base<sglr::pdec::VertexToFragmentVarying,_std::allocator<sglr::pdec::VertexToFragmentVarying>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<sglr::pdec::VertexToFragmentVarying,std::allocator<sglr::pdec::VertexToFragmentVarying>>
    ::_M_realloc_insert<sglr::pdec::VertexToFragmentVarying_const&>
              ((vector<sglr::pdec::VertexToFragmentVarying,std::allocator<sglr::pdec::VertexToFragmentVarying>>
                *)&this->m_vertexToFragmentVaryings,__position,v);
  }
  else {
    *__position._M_current = *v;
    ppVVar1 = &(this->m_vertexToFragmentVaryings).
               super__Vector_base<sglr::pdec::VertexToFragmentVarying,_std::allocator<sglr::pdec::VertexToFragmentVarying>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppVVar1 = *ppVVar1 + 1;
  }
  return this;
}

Assistant:

ShaderProgramDeclaration& pdec::ShaderProgramDeclaration::operator<< (const VertexToFragmentVarying& v)
{
	m_vertexToFragmentVaryings.push_back(v);
	return *this;
}